

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_combine
              (secp256k1_context *ctx,secp256k1_pubkey *pubnonce,secp256k1_pubkey **pubnonces,
              size_t n)

{
  int iVar1;
  ulong in_RCX;
  long in_RDX;
  void *in_RSI;
  secp256k1_ge Q;
  secp256k1_gej Qj;
  size_t i;
  secp256k1_ge *in_stack_00000100;
  secp256k1_gej *in_stack_00000108;
  secp256k1_gej *in_stack_00000110;
  char *in_stack_fffffffffffffef8;
  secp256k1_callback *in_stack_ffffffffffffff00;
  secp256k1_ge *in_stack_ffffffffffffff38;
  secp256k1_ge *in_stack_ffffffffffffff40;
  secp256k1_context *in_stack_ffffffffffffff48;
  secp256k1_ge *in_stack_ffffffffffffff50;
  ulong local_30;
  int local_4;
  
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RCX == 0) {
      secp256k1_callback_call(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_4 = 0;
    }
    else if (in_RDX == 0) {
      secp256k1_callback_call(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_4 = 0;
    }
    else {
      secp256k1_gej_set_infinity((secp256k1_gej *)0x104e91);
      for (local_30 = 0; local_30 < in_RCX; local_30 = local_30 + 1) {
        if (*(long *)(in_RDX + local_30 * 8) == 0) {
          secp256k1_callback_call(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
          return 0;
        }
        secp256k1_pubkey_load
                  (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                   (secp256k1_pubkey *)in_stack_ffffffffffffff38);
        secp256k1_gej_add_ge(in_stack_00000110,in_stack_00000108,in_stack_00000100);
      }
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x104f60);
      if (iVar1 == 0) {
        secp256k1_ge_set_gej(in_stack_ffffffffffffff50,(secp256k1_gej *)in_stack_ffffffffffffff48);
        secp256k1_pubkey_save
                  ((secp256k1_pubkey *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ec_pubkey_combine(const secp256k1_context* ctx, secp256k1_pubkey *pubnonce, const secp256k1_pubkey * const *pubnonces, size_t n) {
    size_t i;
    secp256k1_gej Qj;
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(n >= 1);
    ARG_CHECK(pubnonces != NULL);

    secp256k1_gej_set_infinity(&Qj);

    for (i = 0; i < n; i++) {
        ARG_CHECK(pubnonces[i] != NULL);
        secp256k1_pubkey_load(ctx, &Q, pubnonces[i]);
        secp256k1_gej_add_ge(&Qj, &Qj, &Q);
    }
    if (secp256k1_gej_is_infinity(&Qj)) {
        return 0;
    }
    secp256k1_ge_set_gej(&Q, &Qj);
    secp256k1_pubkey_save(pubnonce, &Q);
    return 1;
}